

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

uint crnlib::rg_etc1::pack_etc1_block
               (void *pETC1_block,uint *pSrc_pixels_rgba,etc1_pack_params *pack_params)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  int *piVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ushort *puVar21;
  long lVar22;
  int *piVar23;
  undefined8 uVar24;
  byte *pbVar25;
  bool bVar26;
  int iVar27;
  ulong *puVar28;
  byte bVar29;
  uint uVar30;
  long lVar31;
  ushort uVar32;
  undefined4 *puVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  uint8 best_selectors [2] [8];
  color_quad_u8 subblock_pixels [8];
  results results [3];
  uint8 selectors [3] [8];
  color_quad_u8 dithered_pixels [16];
  etc1_optimizer optimizer;
  uint local_35c;
  int *local_348;
  ulong local_338;
  ulong local_330;
  uint local_324;
  uint local_320;
  ulong local_310;
  byte local_308 [24];
  int *local_2f0;
  ulong local_2e8;
  uint local_2e0;
  uint local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b0;
  undefined8 local_2a8;
  ulong *local_2a0;
  ulong local_298;
  etc1_pack_params local_290;
  undefined4 local_288;
  undefined8 *local_280;
  undefined1 local_278;
  int *local_270;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined1 local_260;
  ulong local_258;
  undefined4 local_250;
  undefined4 uStack_24c;
  uint local_248;
  undefined1 *local_240;
  undefined1 local_238 [8];
  ulong local_230;
  undefined8 local_228;
  uint local_220;
  undefined1 *local_218;
  ulong local_208;
  undefined4 local_200;
  uint local_1fc;
  uint local_1f8;
  etc1_pack_params *local_1f0;
  byte local_1e8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  byte *local_1c0 [3];
  undefined8 local_1a8;
  undefined4 local_1a0;
  byte *local_198;
  undefined1 local_188 [8];
  undefined1 local_180 [8];
  etc1_pack_params local_178 [2];
  uint local_168 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [7] [16];
  undefined1 local_a8 [16];
  etc1_solution_coordinates local_88 [2];
  uint64 local_70;
  bool local_68;
  etc1_solution_coordinates local_60 [2];
  uint64 local_48;
  bool local_40;
  
  uVar20 = *pSrc_pixels_rgba >> 8;
  uVar11 = 0x10;
  while( true ) {
    uVar9 = (int)uVar11 - 1;
    uVar11 = (ulong)uVar9;
    if (pSrc_pixels_rgba[uVar11] != *pSrc_pixels_rgba) break;
    if (uVar9 < 2) goto code_r0x0019e428;
  }
  if (pack_params->m_dithering == true) {
    piVar15 = (int *)(local_128 + 0x10);
    puVar12 = local_168;
    local_168[0] = 0xffffffff;
    local_168[1] = 0xffffffff;
    local_168[2] = 0xffffffff;
    local_168[3] = 0xffffffff;
    local_168[4] = 0xffffffff;
    local_168[5] = 0xffffffff;
    local_168[6] = 0xffffffff;
    local_168[7] = 0xffffffff;
    local_168[8] = 0xffffffff;
    local_168[9] = 0xffffffff;
    local_168[10] = 0xffffffff;
    local_168[0xb] = 0xffffffff;
    local_168[0xc] = 0xffffffff;
    local_168[0xd] = 0xffffffff;
    local_168[0xe] = 0xffffffff;
    local_168[0xf] = 0xffffffff;
    piVar23 = (int *)local_128;
    lVar22 = 0;
    do {
      local_118[0] = (undefined1  [16])0x0;
      local_128 = (undefined1  [16])0x0;
      lVar31 = 0;
      piVar4 = piVar15;
      do {
        piVar15 = piVar23;
        piVar23 = piVar4;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31);
        bVar7 = (&DAT_001ec928)[(long)(*piVar23 * 5 + piVar23[1] * 3 >> 4) + (ulong)bVar17];
        *(byte *)((long)puVar12 + lVar31) = bVar7;
        iVar19 = (uint)bVar17 - (uint)bVar7;
        *piVar15 = iVar19;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31 + 4);
        bVar7 = (&DAT_001ec928)
                [(long)(piVar23[1] * 5 + piVar23[2] * 3 + iVar19 * 7 + *piVar23 >> 4) +
                 (ulong)bVar17];
        *(byte *)((long)puVar12 + lVar31 + 4) = bVar7;
        iVar19 = (uint)bVar17 - (uint)bVar7;
        piVar15[1] = iVar19;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31 + 8);
        bVar7 = (&DAT_001ec928)
                [(long)(piVar23[2] * 5 + piVar23[3] * 3 + iVar19 * 7 + piVar23[1] >> 4) +
                 (ulong)bVar17];
        *(byte *)((long)puVar12 + lVar31 + 8) = bVar7;
        iVar19 = (uint)bVar17 - (uint)bVar7;
        piVar15[2] = iVar19;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31 + 0xc);
        bVar7 = (&DAT_001ec928)
                [(long)(piVar23[3] * 5 + iVar19 * 7 + piVar23[2] >> 4) + (ulong)bVar17];
        *(byte *)((long)puVar12 + lVar31 + 0xc) = bVar7;
        piVar15[3] = (uint)bVar17 - (uint)bVar7;
        lVar31 = lVar31 + 0x10;
        piVar4 = piVar15;
      } while ((int)lVar31 != 0x40);
      lVar22 = lVar22 + 1;
      puVar12 = (uint *)((long)puVar12 + 1);
      pSrc_pixels_rgba = (uint *)((long)pSrc_pixels_rgba + 1);
    } while (lVar22 != 3);
    pSrc_pixels_rgba = local_168;
  }
  piVar15 = (int *)0x0;
  local_88[0].m_color4 = false;
  local_88[0].m_unscaled_color.field_0 = (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  local_88[0].m_inten_table = 0;
  local_70 = 0xffffffffffffffff;
  local_68 = false;
  local_60[0].m_unscaled_color.field_0 = (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  local_60[0].m_inten_table = 0;
  local_60[0].m_color4 = false;
  local_348 = (int *)0xffffffffffffffff;
  local_48 = 0xffffffffffffffff;
  local_40 = false;
  local_128 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_1c8 = 8;
  local_1c0[0] = local_308;
  local_1a0 = 8;
  local_198 = local_308 + 8;
  local_248 = 8;
  local_240 = local_188;
  local_220 = 8;
  local_218 = local_180;
  local_1f8 = 8;
  local_1f0 = local_178;
  local_290 = *pack_params;
  local_278 = 0;
  local_270 = (int *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_268 = 1;
  uStack_264 = 0;
  local_260 = 0;
  local_288 = 8;
  local_280 = &local_2d8;
  bVar26 = false;
  local_2b0 = 0;
  bVar3 = false;
  bVar36 = true;
LAB_0019e852:
  local_35c = 0;
  bVar2 = true;
LAB_0019e85d:
  piVar15 = (int *)CONCAT71((int7)((ulong)piVar15 >> 8),1);
  uVar24 = 0;
  lVar22 = 0;
  local_2f0 = (int *)0x0;
  puVar28 = &local_258;
LAB_0019e874:
  local_2dc = (uint)piVar15;
  if (bVar36) {
    local_2d8 = CONCAT44(local_2d8._4_4_,pSrc_pixels_rgba[lVar22 * 2]);
    local_2d8 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 4],pSrc_pixels_rgba[lVar22 * 2]);
    uStack_2d0 = CONCAT44(uStack_2d0._4_4_,pSrc_pixels_rgba[lVar22 * 2 + 8]);
    uStack_2d0 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 0xc],pSrc_pixels_rgba[lVar22 * 2 + 8]);
    local_2c8 = CONCAT44(local_2c8._4_4_,pSrc_pixels_rgba[lVar22 * 2 + 1]);
    local_2c8 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 5],pSrc_pixels_rgba[lVar22 * 2 + 1]);
    uStack_2c0 = CONCAT44(uStack_2c0._4_4_,pSrc_pixels_rgba[lVar22 * 2 + 9]);
    uStack_2c0 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 0xd],pSrc_pixels_rgba[lVar22 * 2 + 9]);
  }
  else {
    local_2c8 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8 + 4);
    uStack_2c0 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8 + 4 + 2);
    local_2d8 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8);
    uStack_2d0 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8 + 2);
  }
  local_208 = 0xffffffffffffffff;
  if (((int)lVar22 != 0 || local_35c != 0) && 0 < (int)local_290.m_quality) {
    uVar20 = (uint)local_2d8 >> 8;
    uVar11 = 8;
    do {
      uVar9 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar9;
      if (*(uint *)((long)&local_2d8 + uVar11 * 4) != (uint)local_2d8) goto LAB_0019ecd9;
    } while (1 < uVar9);
    local_2a0 = puVar28;
    local_2a8 = uVar24;
    bVar17 = bVar2 & (byte)uVar24;
    puVar33 = (undefined4 *)0x0;
    if (bVar17 != 0) {
      puVar33 = &local_250;
    }
    uVar9 = 0xffffffff;
    puVar21 = (ushort *)0x0;
    local_338 = 1;
    local_310 = 0;
    local_324 = 0;
    local_320 = 0;
    uVar32 = 0;
    uVar11 = 0;
LAB_0019e9bd:
    local_298 = uVar11 + 1;
    uVar13 = (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + uVar11 * 4 + 4);
    uVar6 = uVar20 & 0xff;
    bVar7 = *(byte *)((long)&local_2d8 + uVar13);
    bVar16 = *(byte *)((long)&local_2d8 + uVar11);
    local_2e8 = (ulong)bVar16;
    uVar20 = (uint)CONCAT71((int7)((ulong)puVar21 >> 8),bVar7);
    iVar19 = -1;
LAB_0019ea0d:
    iVar27 = iVar19 + (uint)bVar16;
    if (0xfe < iVar27) {
      iVar27 = 0xff;
    }
    if (iVar27 < 1) {
      iVar27 = 0;
    }
    puVar21 = &g_color8_to_etc_block_config_0_255;
    if (iVar27 != 0) {
      if (iVar27 == 0xff) {
        puVar21 = &DAT_001b9f92;
      }
      else {
        puVar21 = (ushort *)(g_color8_to_etc_block_config_1_to_254 + (long)(iVar27 + -1) * 0x18);
      }
    }
    iVar27 = iVar27 - (uint)bVar16;
    uVar8 = *puVar21;
    uVar1 = uVar32;
LAB_0019ea61:
    puVar21 = puVar21 + 1;
    bVar29 = (byte)uVar8;
    local_2e0 = uVar20;
    if (bVar2 == (bool)(bVar29 & 1)) {
      uVar14 = (ulong)uVar8;
      if ((~bVar17 & 1) == 0 && (uVar8 & 1) != 0) {
        if (7 < ((uint)(uVar8 >> 8) - (uint)*(byte *)((long)puVar33 + uVar11)) + 4)
        goto LAB_0019eb99;
        uVar30 = (uVar8 & 0xff) << 9;
        uVar10 = (uint)*(ushort *)(g_etc1_inverse_lookup + (ulong)uVar6 * 2 + (ulong)uVar30);
        if ((((uVar10 & 0xff) - (uint)*(byte *)((long)puVar33 + local_338)) + 4 < 8) &&
           (uVar32 = *(ushort *)(g_etc1_inverse_lookup + (ulong)bVar7 * 2 + (ulong)uVar30),
           ((uVar32 & 0xff) - (uint)*(byte *)((long)puVar33 + uVar13)) + 4 < 8)) goto LAB_0019eb47;
        uVar8 = *puVar21;
        uVar10 = local_320;
        uVar32 = uVar1;
        goto joined_r0x0019eb1b;
      }
      uVar10 = (uint)*(ushort *)(g_etc1_inverse_lookup + (ulong)uVar6 * 2 + (ulong)bVar29 * 0x200);
      uVar32 = *(ushort *)(g_etc1_inverse_lookup + (ulong)bVar7 * 2 + (ulong)bVar29 * 0x200);
LAB_0019eb47:
      uVar30 = (uint)(uVar32 >> 8) * (uint)(uVar32 >> 8) + iVar27 * iVar27 +
               (uVar10 >> 8) * (uVar10 >> 8);
      if (uVar30 < uVar9) {
        if (uVar30 != 0) {
          local_310 = uVar11 & 0xffffffff;
          local_324 = (uint)uVar8;
          local_320 = uVar10;
          uVar1 = uVar32;
          uVar9 = uVar30;
          goto LAB_0019eb99;
        }
        uVar9 = 0;
        local_310 = uVar11 & 0xffffffff;
        goto LAB_0019ec53;
      }
    }
LAB_0019eb99:
    uVar8 = *puVar21;
    uVar10 = local_320;
    uVar32 = uVar1;
joined_r0x0019eb1b:
    local_320 = uVar10;
    uVar1 = uVar32;
    if (uVar8 == 0xffff) goto LAB_0019eba6;
    goto LAB_0019ea61;
  }
  goto LAB_0019ecd9;
LAB_0019eba6:
  iVar19 = iVar19 + 1;
  if (iVar19 == 2) goto code_r0x0019ebb9;
  goto LAB_0019ea0d;
code_r0x0019ebb9:
  uVar11 = local_298;
  local_338 = uVar13;
  if (local_298 == 3) goto code_r0x0019ebd2;
  goto LAB_0019e9bd;
code_r0x0019ebd2:
  uVar14 = (ulong)local_324;
  if (uVar9 != 0xffffffff) {
LAB_0019ec53:
    local_208 = (ulong)(uVar9 << 3);
    local_1f8 = 8;
    local_1e8 = ~(byte)uVar14 & 1;
    local_1fc = (uint)(uVar14 >> 1) & 7;
    *local_1f0 = (etc1_pack_params)((ulong)((byte)((byte)uVar14 >> 4) & 3) * 0x101010101010101);
    *(char *)((long)&local_200 + local_310) = (char)(uVar14 >> 8);
    *(char *)((long)&local_200 +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + local_310 * 4)) = (char)uVar10;
    *(char *)((long)&local_200 +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + (ulong)((int)local_310 + 1) * 4)) = (char)uVar32;
  }
LAB_0019ecd9:
  piVar23 = (int *)&local_290;
  local_278 = (undefined1)local_35c;
  local_260 = ((byte)uVar24 & bVar2) != 0;
  if ((bool)local_260) {
    uStack_264 = local_250;
  }
  if (local_290.m_quality == cHighQuality) {
    local_268 = 9;
    piVar15 = pack_etc1_block::s_scan_delta_0_to_4;
  }
  else if (local_290.m_quality == cMediumQuality) {
    local_268 = 3;
    piVar15 = pack_etc1_block::s_scan_delta_0_to_1;
  }
  else {
    local_268 = 1;
    piVar15 = pack_etc1_block::s_scan_delta_0;
  }
  local_270 = piVar15;
  etc1_optimizer::init((etc1_optimizer *)local_128,(EVP_PKEY_CTX *)piVar23);
  bVar5 = etc1_optimizer::compute((etc1_optimizer *)local_128);
  if (!bVar5) goto LAB_0019eee5;
  uVar11 = *puVar28;
  if (0 < (int)local_290.m_quality) {
    if (3000 < uVar11) {
      local_268 = 2;
      if (6000 < uVar11) {
        local_268 = 8;
      }
      local_270 = pack_etc1_block::s_scan_delta_5_to_5;
      piVar23 = pack_etc1_block::s_scan_delta_5_to_8;
      if (6000 < uVar11) {
        local_270 = pack_etc1_block::s_scan_delta_5_to_8;
      }
      if (local_290.m_quality == cMediumQuality) {
        local_268 = 4;
      }
      piVar15 = pack_etc1_block::s_scan_delta_2_to_3;
      if (local_290.m_quality == cMediumQuality) {
        local_270 = pack_etc1_block::s_scan_delta_2_to_3;
      }
      bVar5 = etc1_optimizer::compute((etc1_optimizer *)local_128);
      if (!bVar5) goto LAB_0019eee5;
      uVar11 = *puVar28;
    }
    if (local_208 < uVar11) {
      *(undefined4 *)(puVar28 + 1) = local_200;
      *(byte *)(puVar28 + 4) = local_1e8;
      *(uint *)((long)puVar28 + 0xc) = local_1fc;
      *puVar28 = local_208;
      piVar23 = (int *)local_1f0;
      memcpy((void *)puVar28[3],local_1f0,(ulong)local_1f8);
      uVar11 = *puVar28;
    }
  }
  local_2f0 = (int *)((long)local_2f0 + uVar11);
  piVar15 = local_2f0;
  if (local_348 <= local_2f0) goto LAB_0019eee5;
  lVar22 = 1;
  uVar24 = CONCAT71((int7)((ulong)piVar23 >> 8),1);
  piVar15 = (int *)0x0;
  puVar28 = (ulong *)(local_238 + 8);
  if ((local_2dc & 1) == 0) goto code_r0x0019ee75;
  goto LAB_0019e874;
code_r0x0019ee75:
  local_1d0 = CONCAT44(uStack_24c,local_250);
  memcpy(local_308,local_240,(ulong)local_248);
  local_1a8 = local_228;
  memcpy(local_308 + 8,local_218,(ulong)local_220);
  local_2b0 = (ulong)local_35c;
  local_348 = local_2f0;
  bVar26 = bVar3;
LAB_0019eee5:
  local_35c = 1;
  bVar5 = !bVar2;
  bVar2 = false;
  if (bVar5) goto code_r0x0019eefd;
  goto LAB_0019e85d;
code_r0x0019eefd:
  bVar3 = true;
  bVar2 = !bVar36;
  bVar36 = false;
  if (bVar2) goto code_r0x0019ef18;
  goto LAB_0019e852;
code_r0x0019ef18:
  if ((int)local_2b0 == 0) {
    bVar17 = (byte)local_1d0 << 3 |
             (char)((uint)(byte)local_1a8 - (uint)(byte)local_1d0) +
             (char)((int)((uint)(byte)local_1a8 - (uint)(byte)local_1d0) >> 0x1f) * -8;
    bVar7 = local_1d0._1_1_ << 3 |
            (char)((uint)local_1a8._1_1_ - (uint)local_1d0._1_1_) +
            (char)((int)((uint)local_1a8._1_1_ - (uint)local_1d0._1_1_) >> 0x1f) * -8;
    bVar16 = local_1d0._2_1_ << 3 |
             (char)((uint)local_1a8._2_1_ - (uint)local_1d0._2_1_) +
             (char)((int)((uint)local_1a8._2_1_ - (uint)local_1d0._2_1_) >> 0x1f) * -8;
  }
  else {
    bVar17 = (byte)local_1d0 << 4 | (byte)local_1a8;
    bVar7 = local_1d0._1_1_ << 4 | local_1a8._1_1_;
    bVar16 = local_1d0._2_1_ << 4 | local_1a8._2_1_;
  }
  *(byte *)pETC1_block = bVar17;
  *(byte *)((long)pETC1_block + 1) = bVar7;
  *(byte *)((long)pETC1_block + 2) = bVar16;
  *(byte *)((long)pETC1_block + 3) =
       (((char)local_2b0 * '\x02' & 2U) + (char)((ulong)local_1a8 >> 0x20) * '\x04' |
       (byte)(local_1d0._4_4_ << 5)) ^ 2 | bVar26;
  if (bVar26) {
    lVar22 = 0;
    uVar32 = 0;
    uVar8 = 0;
    do {
      uVar1 = (ushort)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 0xf]) *
              2;
      uVar8 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 3]) & 1 |
              (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 0xb]) & 1 |
              (uVar1 & 2) + uVar8 * 4) * 4 +
              (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 7]) & 1) * 2;
      uVar32 = (ushort)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 3]) >>
                       1) |
               *(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 7]) & 0xfffe |
               (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 0xb]) & 0xfffe
                | uVar32 << 3 | uVar1 & 0xfffc) * 2;
      lVar22 = lVar22 + -1;
    } while (lVar22 != -4);
  }
  else {
    uVar20 = 0;
    lVar22 = 1;
    uVar9 = 0;
    do {
      pbVar25 = local_1c0[lVar22 * 5] + 7;
      bVar36 = true;
      do {
        bVar26 = bVar36;
        uVar6 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)*pbVar25) * 2;
        uVar9 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-3]) & 1 |
                (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-1]) & 1 |
                (uVar6 & 2) + uVar9 * 4) * 4 +
                (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-2]) & 1) * 2;
        uVar8 = (ushort)uVar9;
        uVar20 = (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-3]) >> 1) |
                 *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-2]) & 0xfffffffe |
                 (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-1]) & 0xfffffffe |
                  uVar20 << 3 | uVar6 & 0xfffffffc) * 2;
        uVar32 = (ushort)uVar20;
        pbVar25 = pbVar25 + -4;
        bVar36 = false;
      } while (bVar26);
      bVar36 = lVar22 != 0;
      lVar22 = lVar22 + -1;
    } while (bVar36);
  }
  *(char *)((long)pETC1_block + 4) = (char)(uVar32 >> 8);
  *(char *)((long)pETC1_block + 5) = (char)uVar32;
  *(char *)((long)pETC1_block + 6) = (char)(uVar8 >> 8);
  *(char *)((long)pETC1_block + 7) = (char)uVar8;
  goto LAB_0019f1e7;
code_r0x0019e428:
  uVar9 = 0xffffffff;
  local_330 = 0;
  uVar30 = 0;
  uVar10 = 0;
  uVar6 = 0;
  uVar11 = 0;
  do {
    uVar13 = uVar11 + 1;
    bVar17 = (byte)uVar20;
    uVar20 = (uint)*(byte *)((long)pSrc_pixels_rgba +
                            (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                             ::s_next_comp + uVar11 * 4 + 4));
    iVar19 = -1;
    do {
      iVar27 = iVar19 + (uint)*(byte *)((long)pSrc_pixels_rgba + uVar11);
      if (0xfe < iVar27) {
        iVar27 = 0xff;
      }
      if (iVar27 < 1) {
        iVar27 = 0;
      }
      puVar21 = &g_color8_to_etc_block_config_0_255;
      if (iVar27 != 0) {
        if (iVar27 == 0xff) {
          puVar21 = &DAT_001b9f92;
        }
        else {
          puVar21 = (ushort *)(g_color8_to_etc_block_config_1_to_254 + (long)(iVar27 + -1) * 0x18);
        }
      }
      iVar27 = iVar27 - (uint)*(byte *)((long)pSrc_pixels_rgba + uVar11);
      uVar32 = *puVar21;
      uVar34 = uVar30;
      do {
        puVar21 = puVar21 + 1;
        uVar30 = (uint)uVar32;
        uVar18 = (uVar30 & 0xff) << 9;
        uVar32 = *(ushort *)(g_etc1_inverse_lookup + (ulong)bVar17 * 2 + (ulong)uVar18);
        uVar8 = *(ushort *)
                 (g_etc1_inverse_lookup +
                 (ulong)*(byte *)((long)pSrc_pixels_rgba +
                                 (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                                  ::s_next_comp + uVar11 * 4 + 4)) * 2 +
                 (ulong)uVar18);
        uVar35 = (uint)(uVar32 >> 8);
        uVar18 = (uint)(uVar8 >> 8);
        uVar18 = uVar18 * uVar18 + uVar35 * uVar35 + iVar27 * iVar27;
        if (uVar18 < uVar9) {
          uVar10 = uVar32 & 0xff;
          uVar6 = uVar8 & 0xff;
          if (uVar18 == 0) {
            local_348 = (int *)0x0;
            goto LAB_0019ef81;
          }
          local_330 = uVar11 & 0xffffffff;
          uVar9 = uVar18;
          uVar34 = uVar30;
        }
        uVar30 = uVar34;
        uVar32 = *puVar21;
        uVar34 = uVar30;
      } while (uVar32 != 0xffff);
      iVar19 = iVar19 + 1;
    } while (iVar19 != 2);
    uVar11 = uVar13;
  } while (uVar13 != 3);
  local_348 = (int *)(ulong)(uVar9 << 4);
  uVar11 = local_330;
LAB_0019ef81:
  *(byte *)((long)pETC1_block + 3) =
       ((char)uVar30 * '\x02' & 0x1cU) * '\t' + (char)(uVar30 & 1) * '\x02';
  bVar17 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)(uVar30 >> 4 & 3));
  *(short *)((long)pETC1_block + 4) = (short)((int)((uint)bVar17 << 0x1e) >> 0x1f);
  *(ushort *)((long)pETC1_block + 6) = -(bVar17 & 1);
  if ((uVar30 & 1) == 0) {
    *(byte *)((long)pETC1_block + (uVar11 & 0xffffffff)) =
         (byte)((uVar30 >> 8) << 4) | (byte)(uVar30 >> 8);
    *(byte *)((long)pETC1_block +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + (uVar11 & 0xffffffff) * 4)) =
         (byte)(uVar10 << 4) | (byte)uVar10;
    bVar17 = (byte)(uVar6 << 4) | (byte)uVar6;
  }
  else {
    *(char *)((long)pETC1_block + (uVar11 & 0xffffffff)) = (char)((uVar30 >> 8) << 3);
    *(byte *)((long)pETC1_block +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + (uVar11 & 0xffffffff) * 4)) = (byte)uVar10 << 3;
    bVar17 = (byte)uVar6 << 3;
  }
  *(byte *)((long)pETC1_block +
           (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                            ::s_next_comp + (ulong)((int)uVar11 + 1) * 4)) = bVar17;
LAB_0019f1e7:
  return (uint)local_348;
}

Assistant:

unsigned int pack_etc1_block(void* pETC1_block, const unsigned int* pSrc_pixels_rgba, etc1_pack_params& pack_params) {
  const color_quad_u8* pSrc_pixels = reinterpret_cast<const color_quad_u8*>(pSrc_pixels_rgba);
  etc1_block& dst_block = *static_cast<etc1_block*>(pETC1_block);

  color_quad_u8 src_pixel0(pSrc_pixels[0]);

  // Check for solid block.
  const uint32 first_pixel_u32 = pSrc_pixels->m_u32;
  int r;
  for (r = 15; r >= 1; --r)
    if (pSrc_pixels[r].m_u32 != first_pixel_u32)
      break;
  if (!r)
    return static_cast<unsigned int>(16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r));

  color_quad_u8 dithered_pixels[16];
  if (pack_params.m_dithering) {
    dither_block_555(dithered_pixels, pSrc_pixels);
    pSrc_pixels = dithered_pixels;
  }

  etc1_optimizer optimizer;

  uint64 best_error = cUINT64_MAX;
  uint best_flip = false, best_use_color4 = false;

  uint8 best_selectors[2][8];
  etc1_optimizer::results best_results[2];
  for (uint i = 0; i < 2; i++) {
    best_results[i].m_n = 8;
    best_results[i].m_pSelectors = best_selectors[i];
  }

  uint8 selectors[3][8];
  etc1_optimizer::results results[3];

  for (uint i = 0; i < 3; i++) {
    results[i].m_n = 8;
    results[i].m_pSelectors = selectors[i];
  }

  color_quad_u8 subblock_pixels[8];

  etc1_optimizer::params params(pack_params);
  params.m_num_src_pixels = 8;
  params.m_pSrc_pixels = subblock_pixels;

  for (uint flip = 0; flip < 2; flip++) {
    for (uint use_color4 = 0; use_color4 < 2; use_color4++) {
      uint64 trial_error = 0;

      uint subblock;
      for (subblock = 0; subblock < 2; subblock++) {
        if (flip)
          memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
        else {
          const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
          subblock_pixels[0] = pSrc_col[0];
          subblock_pixels[1] = pSrc_col[4];
          subblock_pixels[2] = pSrc_col[8];
          subblock_pixels[3] = pSrc_col[12];
          subblock_pixels[4] = pSrc_col[1];
          subblock_pixels[5] = pSrc_col[5];
          subblock_pixels[6] = pSrc_col[9];
          subblock_pixels[7] = pSrc_col[13];
        }

        results[2].m_error = cUINT64_MAX;
        if ((params.m_quality >= cMediumQuality) && ((subblock) || (use_color4))) {
          const uint32 subblock_pixel0_u32 = subblock_pixels[0].m_u32;
          for (r = 7; r >= 1; --r)
            if (subblock_pixels[r].m_u32 != subblock_pixel0_u32)
              break;
          if (!r) {
            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixels[0].r, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : NULL);
          }
        }

        params.m_use_color4 = (use_color4 != 0);
        params.m_constrain_against_base_color5 = false;

        if ((!use_color4) && (subblock)) {
          params.m_constrain_against_base_color5 = true;
          params.m_base_color5 = results[0].m_block_color_unscaled;
        }

        if (params.m_quality == cHighQuality) {
          static const int s_scan_delta_0_to_4[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_4);
          params.m_pScan_deltas = s_scan_delta_0_to_4;
        } else if (params.m_quality == cMediumQuality) {
          static const int s_scan_delta_0_to_1[] = {-1, 0, 1};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_1);
          params.m_pScan_deltas = s_scan_delta_0_to_1;
        } else {
          static const int s_scan_delta_0[] = {0};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0);
          params.m_pScan_deltas = s_scan_delta_0;
        }

        optimizer.init(params, results[subblock]);
        if (!optimizer.compute())
          break;

        if (params.m_quality >= cMediumQuality) {
          // TODO: Fix fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
          const uint refinement_error_thresh0 = 3000;
          const uint refinement_error_thresh1 = 6000;
          if (results[subblock].m_error > refinement_error_thresh0) {
            if (params.m_quality == cMediumQuality) {
              static const int s_scan_delta_2_to_3[] = {-3, -2, 2, 3};
              params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_2_to_3);
              params.m_pScan_deltas = s_scan_delta_2_to_3;
            } else {
              static const int s_scan_delta_5_to_5[] = {-5, 5};
              static const int s_scan_delta_5_to_8[] = {-8, -7, -6, -5, 5, 6, 7, 8};
              if (results[subblock].m_error > refinement_error_thresh1) {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_8);
                params.m_pScan_deltas = s_scan_delta_5_to_8;
              } else {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_5);
                params.m_pScan_deltas = s_scan_delta_5_to_5;
              }
            }

            if (!optimizer.compute())
              break;
          }

          if (results[2].m_error < results[subblock].m_error)
            results[subblock] = results[2];
        }

        trial_error += results[subblock].m_error;
        if (trial_error >= best_error)
          break;
      }

      if (subblock < 2)
        continue;

      best_error = trial_error;
      best_results[0] = results[0];
      best_results[1] = results[1];
      best_flip = flip;
      best_use_color4 = use_color4;

    }  // use_color4

  }  // flip

  int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
  int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
  int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
  RG_ETC1_ASSERT(best_use_color4 || (rg_etc1::minimum(dr, dg, db) >= cETC1ColorDeltaMin) && (rg_etc1::maximum(dr, dg, db) <= cETC1ColorDeltaMax));

  if (best_use_color4) {
    dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
    dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
    dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
  } else {
    if (dr < 0)
      dr += 8;
    dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
    if (dg < 0)
      dg += 8;
    dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
    if (db < 0)
      db += 8;
    dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
  }

  dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

  uint selector0 = 0, selector1 = 0;
  if (best_flip) {
    // flipped:
    // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
    // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
    //
    // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
    // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
    const uint8* pSelectors0 = best_results[0].m_pSelectors;
    const uint8* pSelectors1 = best_results[1].m_pSelectors;
    for (int x = 3; x >= 0; --x) {
      uint b;
      b = g_selector_index_to_etc1[pSelectors1[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors1[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);
    }
  } else {
    // non-flipped:
    // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
    // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
    //
    // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
    // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
    for (int subblock = 1; subblock >= 0; --subblock) {
      const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
      for (uint i = 0; i < 2; i++) {
        uint b;
        b = g_selector_index_to_etc1[pSelectors[3]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[2]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[1]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[0]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        pSelectors -= 4;
      }
    }
  }

  dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
  dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
  dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
  dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

  return static_cast<unsigned int>(best_error);
}